

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O1

int CheckExts(tchar_t *URL,tchar_t *Exts)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int unaff_EBP;
  tchar_t Ext [256];
  char local_128 [256];
  
  SplitPath(URL,(tchar_t *)0x0,0,(tchar_t *)0x0,0,local_128,0x100);
  pcVar3 = strchr(local_128,0x3f);
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
  }
  sVar4 = strlen(local_128);
  do {
    if (Exts == (char *)0x0) {
      return 0;
    }
    pcVar3 = strchr(Exts,0x3a);
    if (((pcVar3 == (char *)0x0) || (sVar4 != (long)pcVar3 - (long)Exts)) ||
       (iVar2 = tcsnicmp(local_128,Exts,(long)pcVar3 - (long)Exts), iVar2 != 0)) {
      pcVar3 = strchr(Exts,0x3b);
      Exts = pcVar3 + 1;
      if (pcVar3 == (char *)0x0) {
        Exts = (char *)0x0;
      }
      bVar1 = true;
    }
    else {
      unaff_EBP = (int)pcVar3[1];
      bVar1 = false;
    }
  } while (bVar1);
  return unaff_EBP;
}

Assistant:

int CheckExts(const tchar_t* URL, const tchar_t* Exts)
{
    tchar_t Ext[MAXPATH];
    tchar_t* Tail;
    intptr_t ExtLen;

    SplitPath(URL,NULL,0,NULL,0,Ext,TSIZEOF(Ext));
    Tail = tcschr(Ext,'?');
    if (Tail) *Tail = 0;
    ExtLen = tcslen(Ext);

    while (Exts)
    {
        const tchar_t* p = tcschr(Exts,':');
        if (p && (ExtLen == p-Exts) && tcsnicmp(Ext,Exts,p-Exts)==0)
            return p[1]; // return type char
        Exts = tcschr(Exts,';');
        if (Exts) ++Exts;
    }
    return 0;
}